

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

uint32_t utrie2_get32FromLeadSurrogateCodeUnit_63(UTrie2 *trie,UChar32 c)

{
  UChar32 c_local;
  UTrie2 *trie_local;
  
  if ((c & 0xfffffc00U) == 0xd800) {
    if (trie->data16 == (uint16_t *)0x0) {
      if (trie->data32 == (uint32_t *)0x0) {
        trie_local._4_4_ = get32(trie->newTrie,c,'\0');
      }
      else {
        trie_local._4_4_ = trie->data32[(int)((uint)trie->index[c >> 5] * 4 + (c & 0x1fU))];
      }
    }
    else {
      trie_local._4_4_ = (uint)trie->index[(int)((uint)trie->index[c >> 5] * 4 + (c & 0x1fU))];
    }
  }
  else {
    trie_local._4_4_ = trie->errorValue;
  }
  return trie_local._4_4_;
}

Assistant:

U_CAPI uint32_t U_EXPORT2
utrie2_get32FromLeadSurrogateCodeUnit(const UTrie2 *trie, UChar32 c) {
    if(!U_IS_LEAD(c)) {
        return trie->errorValue;
    }
    if(trie->data16!=NULL) {
        return UTRIE2_GET16_FROM_U16_SINGLE_LEAD(trie, c);
    } else if(trie->data32!=NULL) {
        return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
    } else {
        return get32(trie->newTrie, c, FALSE);
    }
}